

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O3

void cradix_rantala(LPPSTR a,UINT n)

{
  Stack *pSVar1;
  int *piVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  size_t i_1;
  LPPSTR ta;
  LPBYTE __ptr;
  LPPSTR ppuVar7;
  size_t i;
  ulong uVar8;
  byte *pbVar9;
  size_t __n;
  void *__src;
  uchar **a_00;
  ulong uVar10;
  UINT d;
  ulong uVar11;
  ulong uVar12;
  ulong *count_00;
  long lVar13;
  byte *__src_00;
  UINT count [256];
  LPPSTR GrpKP [256];
  LPSTR GrpKB [256];
  UINT local_1838;
  ulong local_1830 [255];
  LPPSTR local_1038;
  long alStack_1030 [255];
  byte *local_838 [257];
  
  ta = (LPPSTR)malloc(n * 8);
  __ptr = (LPBYTE)malloc(n * 4);
  _sp->sa = a;
  _sp->sk = __ptr;
  _sp->sn = (int)n;
  pSVar1 = _sp + 1;
  piVar2 = &_sp->sb;
  _sp = pSVar1;
  *piVar2 = 0;
  memset(&local_1838,0,0x7f8);
  if (stack < pSVar1) {
    _sp = pSVar1;
    do {
      count_00 = &local_1838;
      pSVar1 = _sp + -1;
      a_00 = _sp[-1].sa;
      __src_00 = _sp[-1].sk;
      uVar4 = _sp[-1].sn;
      uVar12 = (ulong)(int)uVar4;
      iVar5 = _sp[-1].sb;
      d = (UINT)iVar5;
      _sp = pSVar1;
      if (__src_00 == (byte *)0x0) {
LAB_002508d2:
        RDFK(&local_1038,a_00,uVar12,ta,count_00,d);
      }
      else {
        uVar10 = d & 3;
        if (uVar10 == 0) {
          if (uVar4 < 0x81) goto LAB_002508d2;
          uVar8 = 0;
          pbVar9 = __src_00;
          do {
            puVar6 = a_00[uVar8];
            lVar13 = 0;
            do {
              bVar3 = puVar6[lVar13 + d];
              pbVar9[lVar13] = bVar3;
              if (bVar3 == 0) {
                pbVar9[lVar13] = 0;
                break;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 4);
            uVar8 = uVar8 + 1;
            pbVar9 = pbVar9 + 4;
          } while (uVar8 != uVar12);
          uVar8 = 0;
          do {
            (&local_1838)[__src_00[uVar8 * 4]] = (&local_1838)[__src_00[uVar8 * 4]] + 1;
            uVar8 = uVar8 + 1;
          } while (uVar12 != uVar8);
        }
        else if (uVar4 != 0) {
          uVar8 = uVar12;
          pbVar9 = __src_00;
          do {
            (&local_1838)[*pbVar9] = (&local_1838)[*pbVar9] + 1;
            pbVar9 = pbVar9 + (4 - uVar10);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        do {
          uVar8 = *count_00;
          count_00 = count_00 + 1;
        } while (uVar8 == 0);
        __n = uVar12 * 8;
        uVar11 = uVar10 ^ 3;
        local_1038 = a_00;
        local_838[0] = __src_00;
        lVar13 = 0;
        ppuVar7 = a_00;
        pbVar9 = __src_00;
        do {
          ppuVar7 = ppuVar7 + (&local_1838)[lVar13];
          alStack_1030[lVar13] = (long)ppuVar7;
          pbVar9 = pbVar9 + (&local_1838)[lVar13] * uVar11;
          local_838[lVar13 + 1] = pbVar9;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0xff);
        lVar13 = 4 - uVar10;
        if (uVar12 <= uVar8) {
          __n = 0;
        }
        memcpy(ta,a_00,__n);
        if (uVar8 < uVar12) {
          uVar8 = 0;
          pbVar9 = __src_00;
          do {
            *(uchar **)alStack_1030[(ulong)*pbVar9 - 1] = ta[uVar8];
            alStack_1030[(ulong)*pbVar9 - 1] = alStack_1030[(ulong)*pbVar9 - 1] + 8;
            uVar8 = uVar8 + 1;
            pbVar9 = pbVar9 + lVar13;
          } while (uVar12 != uVar8);
        }
        memcpy(ta,__src_00,lVar13 * uVar12);
        if (uVar4 != 0) {
          __src = (void *)((long)ta + 1);
          do {
            bVar3 = *(byte *)((long)__src + -1);
            pbVar9 = local_838[bVar3];
            if ((int)uVar10 != 3) {
              memcpy(pbVar9,__src,uVar11 + (uVar11 == 0));
            }
            local_838[bVar3] = pbVar9 + uVar11;
            __src = (void *)((long)__src + lVar13);
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        lVar13 = 0;
        do {
          if (lVar13 != 0) {
            uVar12 = (&local_1838)[lVar13];
            if (uVar12 < 0x15) {
              if (1 < uVar12) {
                insertion_sort(a_00,(int)uVar12,d);
              }
            }
            else {
              _sp->sa = a_00;
              _sp->sk = __src_00;
              _sp->sn = (int)uVar12;
              piVar2 = &_sp->sb;
              _sp = _sp + 1;
              *piVar2 = iVar5 + 1;
            }
          }
          a_00 = a_00 + (&local_1838)[lVar13];
          __src_00 = __src_00 + (&local_1838)[lVar13] * uVar11;
          (&local_1838)[lVar13] = 0;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0xff);
      }
    } while (stack < _sp);
  }
  free(ta);
  free(__ptr);
  return;
}

Assistant:

void cradix_rantala(LPPSTR a, UINT n)
{
	UINT kbsd, kbsd1, i, j, stage, d, MEMSIZE;
	UINT *cptr, gs, count[AS];
	LPSTR tj, tk, ax, tl, kb, ss, tt, GrpKB[AS];
	LPPSTR GrpKP[AS], ak, ta, tc, t;
	if (sizeof(LPPSTR)>sizeof(unsigned char)*BS)
		MEMSIZE=sizeof(LPPSTR);
	else
		MEMSIZE=sizeof(unsigned char)*BS;
	/* workspace */
	ta = (LPPSTR)malloc(n * MEMSIZE);
	/* memory for key buffers */
	tk = (LPBYTE)malloc(n * sizeof(unsigned char) * BS);
	tj=tk;
	push(a, tk, n, 0); for (i=AL; i<AH; i++) count[i]=0;
	while (!stackempty()) {
		pop(a, tk, n, stage);
		if (tk) {
			/* set the counters and
			   fill the key buffers if necessary */
			if ((d=stage%BS)!=0)
				for (i=0, tl=tk; i<n; i++, tl+=(BS-d))
					count[*tl]++;
			else {
				if (n>KBC)
					FillKeyBuffer(a, tk, count, n, stage);
				else {
					RDFK(GrpKP, a, n, ta, count, stage);
					continue;
				}
			}
			/* check if there is only 1 group */
			cptr=&count[AL];
			while (*cptr<1) cptr++;
			if (*cptr<n) gs=n; else gs=0;
			/* calculate both key ptr and
			   key buffer addresses */
			kbsd=BS-d, kbsd1=kbsd-1;
			GrpKP[AL]=a; GrpKB[AL]=tk;
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				GrpKP[i+1]=ak+=count[i];
				GrpKB[i+1]=ax+=count[i]*kbsd1;
			}

			/* permute the key ptrs */
			memcpy(ta, a, sizeof(LPSTR)*gs);
			for (i=0, ax=tk, tc=ta; i<gs;
					i++, ax+=kbsd, tc++) {
				*GrpKP[*ax]=*tc; GrpKP[*ax]++;
			}
			/* permute the key buffers */
			memcpy(ta, tk, sizeof(unsigned char)*n*kbsd);
			for (i=0, kb=(LPBYTE)ta; i<n; i++, *t+=kbsd1) {
				t=&GrpKB[*kb]; ss=*t; tt=kb+1;
				for (j=0; j<kbsd1; j++)
				{ *ss=*tt; ss++; tt++; }
				kb+=kbsd;
			}
			/* down 1 level */
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				if (splittable(i))
				{ push(ak, ax, count[i], stage+1); }
				else if (count[i]>1 && i>0)
					insertion_sort(ak, count[i], stage);
				ak+=count[i]; ax+=count[i]*(kbsd1);
				count[i]=0;
			}
		}
		else RDFK(GrpKP, a, n, ta, count, stage);
	}
	free((void*)ta);
	free((void*)tj);
}